

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

HairMaterial *
pbrt::HairMaterial::Create(TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  HairMaterial *pHVar2;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  FloatTextureHandle alpha;
  FloatTextureHandle beta_n;
  FloatTextureHandle beta_m;
  FloatTextureHandle eta;
  FloatTextureHandle pheomelanin;
  FloatTextureHandle eumelanin;
  SpectrumTextureHandle color;
  SpectrumTextureHandle sigma_a;
  SpectrumTextureHandle *in_stack_fffffffffffffd48;
  FileLoc *in_stack_fffffffffffffd50;
  RGBSpectrum *in_stack_fffffffffffffd58;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffd60;
  Float FVar3;
  string *in_stack_fffffffffffffd68;
  string *psVar4;
  TextureParameterDictionary *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Allocator in_stack_fffffffffffffd78;
  Allocator alloc_00;
  allocator<char> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  char *in_stack_fffffffffffffd88;
  SpectrumTextureHandle *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  polymorphic_allocator<std::byte> *this_01;
  string *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  Allocator alloc_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7;
  undefined8 in_stack_fffffffffffffde0;
  SpectrumType spectrumType;
  string *in_stack_fffffffffffffde8;
  TextureParameterDictionary *in_stack_fffffffffffffdf0;
  Allocator in_stack_fffffffffffffdf8;
  undefined8 local_1d9;
  undefined8 local_1b0;
  undefined8 local_1a1;
  undefined8 local_178;
  undefined8 local_169;
  RGBSpectrum *local_118;
  undefined8 local_108;
  undefined1 local_f9 [33];
  TaggedPointer local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c1;
  TaggedPointer local_a0 [8];
  undefined8 local_98;
  allocator<char> local_89;
  string local_88 [32];
  TaggedPointer local_68 [8];
  undefined8 local_60;
  allocator<char> local_41;
  string local_40 [32];
  TaggedPointer local_20 [16];
  undefined8 local_10;
  undefined8 local_8;
  
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  local_10 = in_RDI;
  local_8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_60 = local_8;
  TextureParameterDictionary::GetSpectrumTextureOrNull
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,spectrumType,
             in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  args_7 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_98 = local_8;
  TextureParameterDictionary::GetSpectrumTextureOrNull
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,spectrumType,
             in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  alloc_01.memoryResource = (memory_resource *)&local_c1;
  this_02 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_d0 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)this_02,in_stack_fffffffffffffda8,alloc_01);
  std::__cxx11::string::~string((string *)((long)&local_c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  psVar4 = (string *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_108 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)this_02,psVar4,alloc_01);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
  if (bVar1) {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_68);
    FVar3 = (Float)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    if (bVar1) {
      Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
    }
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_a0);
    if (bVar1) {
      Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
    }
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_d8);
    if (bVar1) {
      Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
    }
  }
  else {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_68);
    if (bVar1) {
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
      FVar3 = (Float)((ulong)in_stack_fffffffffffffd60 >> 0x20);
      if (bVar1) {
        Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
      }
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_a0);
      if (bVar1) {
        Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
      }
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_d8);
      if (bVar1) {
        Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
      }
    }
    else {
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_a0);
      if ((bVar1) || (bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_d8), bVar1)) {
        FVar3 = (Float)((ulong)in_stack_fffffffffffffd60 >> 0x20);
        bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
        if (bVar1) {
          Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
        }
        bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_68);
        if (bVar1) {
          Warning(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
        }
      }
      else {
        HairBxDF::SigmaAFromConcentration((Float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
        local_118 = pstd::pmr::polymorphic_allocator<std::byte>::
                    new_object<pbrt::RGBSpectrum,pbrt::RGBSpectrum>
                              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        pstd::pmr::polymorphic_allocator<std::byte>::
        new_object<pbrt::SpectrumConstantTexture,pbrt::RGBSpectrum*>
                  (in_stack_fffffffffffffd60,(RGBSpectrum **)in_stack_fffffffffffffd58);
        FVar3 = (Float)((ulong)in_stack_fffffffffffffd60 >> 0x20);
        SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumConstantTexture>
                  ((SpectrumTextureHandle *)in_stack_fffffffffffffd50,
                   (SpectrumConstantTexture *)in_stack_fffffffffffffd48);
        SpectrumTextureHandle::operator=
                  ((SpectrumTextureHandle *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
    }
  }
  this_01 = (polymorphic_allocator<std::byte> *)&local_169;
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_178 = local_8;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,FVar3,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string((string *)((long)&local_169 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  args_1 = (SpectrumTextureHandle *)&local_1a1;
  __a = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)args_1,(allocator<char> *)__a);
  local_1b0 = local_8;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,FVar3,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string((string *)((long)&local_1a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  alloc_00.memoryResource = (memory_resource *)&local_1d9;
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)args_1,(allocator<char> *)__a);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)this,in_stack_fffffffffffffd68,FVar3,alloc_00);
  std::__cxx11::string::~string((string *)((long)&local_1d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  psVar4 = (string *)&stack0xfffffffffffffdef;
  FVar3 = local_10._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)args_1,(allocator<char> *)__a);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)this,psVar4,FVar3,alloc_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
  pHVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HairMaterial,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&>
                     (this_01,(SpectrumTextureHandle *)this_00,args_1,(FloatTextureHandle *)__a,
                      (FloatTextureHandle *)alloc_00.memoryResource,(FloatTextureHandle *)this,
                      (FloatTextureHandle *)this_02,(FloatTextureHandle *)alloc_01.memoryResource,
                      (FloatTextureHandle *)args_7);
  return pHVar2;
}

Assistant:

HairMaterial *HairMaterial::Create(const TextureParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle sigma_a =
        parameters.GetSpectrumTextureOrNull("sigma_a", SpectrumType::General, alloc);
    SpectrumTextureHandle color =
        parameters.GetSpectrumTextureOrNull("color", SpectrumType::Reflectance, alloc);
    FloatTextureHandle eumelanin = parameters.GetFloatTextureOrNull("eumelanin", alloc);
    FloatTextureHandle pheomelanin =
        parameters.GetFloatTextureOrNull("pheomelanin", alloc);
    if (sigma_a) {
        if (color)
            Warning(loc, R"(Ignoring "color" parameter since "sigma_a" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"sigma_a\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"sigma_a\" was "
                         "provided.");
    } else if (color) {
        if (sigma_a)
            Warning(loc, R"(Ignoring "sigma_a" parameter since "color" was provided.)");
        if (eumelanin)
            Warning(loc, "Ignoring \"eumelanin\" parameter since \"color\" was "
                         "provided.");
        if (pheomelanin)
            Warning(loc, "Ignoring \"pheomelanin\" parameter since \"color\" was "
                         "provided.");
    } else if (eumelanin || pheomelanin) {
        if (sigma_a)
            Warning(loc, "Ignoring \"sigma_a\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
        if (color)
            Warning(loc, "Ignoring \"color\" parameter since "
                         "\"eumelanin\"/\"pheomelanin\" was provided.");
    } else {
        // Default: brown-ish hair.
        sigma_a = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<RGBSpectrum>(HairBxDF::SigmaAFromConcentration(1.3, 0.)));
    }

    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.55f, alloc);
    FloatTextureHandle beta_m = parameters.GetFloatTexture("beta_m", 0.3f, alloc);
    FloatTextureHandle beta_n = parameters.GetFloatTexture("beta_n", 0.3f, alloc);
    FloatTextureHandle alpha = parameters.GetFloatTexture("alpha", 2.f, alloc);

    return alloc.new_object<HairMaterial>(sigma_a, color, eumelanin, pheomelanin, eta,
                                          beta_m, beta_n, alpha);
}